

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chapter2.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * chapter2::pent_series(int pos)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  int local_14;
  int local_10;
  int local_c;
  int ix;
  int pos_local;
  
  local_c = pos;
  if ((pent_series(int)::elem == '\0') &&
     (iVar2 = __cxa_guard_acquire(&pent_series(int)::elem), iVar2 != 0)) {
    std::vector<int,_std::allocator<int>_>::vector(&pent_series::elem);
    __cxa_atexit(std::vector<int,_std::allocator<int>_>::~vector,&pent_series::elem,&__dso_handle);
    __cxa_guard_release(&pent_series(int)::elem);
  }
  bVar1 = check_validity(local_c);
  if ((bVar1) &&
     (uVar3 = (ulong)local_c,
     sVar4 = std::vector<int,_std::allocator<int>_>::size(&pent_series::elem), sVar4 < uVar3)) {
    sVar4 = std::vector<int,_std::allocator<int>_>::size(&pent_series::elem);
    local_10 = (int)sVar4;
    while (local_10 = local_10 + 1, local_10 <= local_c) {
      local_14 = (local_10 * (local_10 * 3 + -1)) / 2;
      std::vector<int,_std::allocator<int>_>::push_back(&pent_series::elem,&local_14);
    }
  }
  return &pent_series::elem;
}

Assistant:

const vector<int> * pent_series(int pos) {
        static vector<int> elem;
        if (check_validity(pos) && pos > elem.size()) {
            for (int ix = static_cast<int>(elem.size() + 1); ix <= pos; ++ix) {
                elem.push_back(ix * (3 * ix - 1) / 2);
            }
        }

        return &elem;
    }